

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::writeLPF
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  double dVar1;
  double dVar2;
  SPxSense SVar3;
  int iVar4;
  double *pdVar5;
  ostream *poVar6;
  ulong *puVar7;
  Item *pIVar8;
  int i;
  int iVar9;
  long lVar10;
  char *pcVar11;
  int j;
  double local_80;
  double lhs;
  double rhs;
  NameSet *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  DSVectorBase<double> svec;
  
  lVar10 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar10 + -0x18) + 8) = 0x10;
  lVar10 = *(long *)(lVar10 + -0x18);
  *(uint *)(p_output + lVar10 + 0x18) = *(uint *)(p_output + lVar10 + 0x18) & 0xfffffefb | 0x100;
  SVar3 = this->thesense;
  pcVar11 = "Maximize\n";
  if (SVar3 == MINIMIZE) {
    pcVar11 = "Minimize\n";
  }
  std::operator<<(p_output,pcVar11);
  std::operator<<(p_output,"  obj: ");
  DSVectorBase<double>::DSVectorBase
            (&svec,(int)((ulong)((long)(this->super_LPColSetBase<double>).object.val.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                (long)(this->super_LPColSetBase<double>).object.val.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start) >> 3));
  DSVectorBase<double>::operator=(&svec,&(this->super_LPColSetBase<double>).object);
  lhs = (double)SVar3;
  SVectorBase<double>::operator*=(&svec.super_SVectorBase<double>,&lhs);
  LPFwriteSVector<double>(this,p_output,p_cnames,&svec.super_SVectorBase<double>,writeZeroObjective)
  ;
  std::operator<<(p_output,"\n");
  DSVectorBase<double>::~DSVectorBase(&svec);
  std::operator<<(p_output,"Subject To\n");
  local_68 = p_rnames;
  for (lVar10 = 0; lVar10 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar10 = lVar10 + 1) {
    dVar1 = (this->super_LPRowSetBase<double>).left.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    dVar2 = (this->super_LPRowSetBase<double>).right.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    lhs = dVar1;
    rhs = dVar2;
    pdVar5 = (double *)infinity();
    iVar9 = (int)lVar10;
    if (dVar1 <= -*pdVar5) {
LAB_001b596b:
      poVar6 = std::operator<<(p_output," ");
      pcVar11 = LPFgetRowName<double>(this,iVar9,p_rnames,(char *)&svec,iVar9);
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::operator<<(poVar6," : ");
      pIVar8 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar10].idx;
      pdVar5 = &lhs;
    }
    else {
      pdVar5 = (double *)infinity();
      if (*pdVar5 <= dVar2) goto LAB_001b596b;
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_001b596b;
      poVar6 = std::operator<<(p_output," ");
      pcVar11 = LPFgetRowName<double>(this,iVar9,p_rnames,(char *)&svec,iVar9);
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::operator<<(poVar6,"_1 : ");
      iVar4 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar10].idx;
      pIVar8 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem;
      pdVar5 = (double *)infinity();
      local_80 = *pdVar5;
      LPFwriteRow<double>(this,p_output,p_cnames,(SVectorBase<double> *)(pIVar8 + iVar4),&lhs,
                          &local_80);
      poVar6 = std::operator<<(p_output," ");
      p_rnames = local_68;
      pcVar11 = LPFgetRowName<double>(this,iVar9,local_68,(char *)&svec,iVar9);
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::operator<<(poVar6,"_2 : ");
      pIVar8 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar10].idx;
      pdVar5 = (double *)infinity();
      local_80 = -*pdVar5;
      pdVar5 = &local_80;
    }
    LPFwriteRow<double>(this,p_output,p_cnames,(SVectorBase<double> *)pIVar8,pdVar5,&rhs);
  }
  std::operator<<(p_output,"Bounds\n");
  lVar10 = 0;
  do {
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= lVar10) {
      if ((p_intvars != (DIdxSet *)0x0) && (0 < (p_intvars->super_IdxSet).num)) {
        std::operator<<(p_output,"Generals\n");
        for (iVar9 = 0;
            iVar9 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
            iVar9 = iVar9 + 1) {
          iVar4 = IdxSet::pos(&p_intvars->super_IdxSet,iVar9);
          if (-1 < iVar4) {
            poVar6 = std::operator<<(p_output,"  ");
            pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
            poVar6 = std::operator<<(poVar6,pcVar11);
            std::operator<<(poVar6,"\n");
          }
        }
      }
      poVar6 = std::operator<<(p_output,"End");
      std::endl<char,std::char_traits<char>>(poVar6);
      return;
    }
    dVar1 = (this->super_LPColSetBase<double>).low.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    dVar2 = (this->super_LPColSetBase<double>).up.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar10];
    iVar9 = (int)lVar10;
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      puVar7 = (ulong *)infinity();
      local_68 = (NameSet *)(*puVar7 ^ 0x8000000000000000);
      uStack_60 = 0;
      uStack_5c = 0x80000000;
      pdVar5 = (double *)infinity();
      if ((double)local_68 < dVar1) {
        if (dVar2 < *pdVar5) {
          poVar6 = std::operator<<(p_output,"  ");
          if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_001b5b5a;
          poVar6 = std::ostream::_M_insert<double>(dVar1);
          poVar6 = std::operator<<(poVar6," <= ");
          pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
          poVar6 = std::operator<<(poVar6,pcVar11);
          pcVar11 = " <= ";
          goto LAB_001b5a68;
        }
        if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_001b5a85;
        std::operator<<(p_output,"  ");
        poVar6 = std::ostream::_M_insert<double>(dVar1);
        poVar6 = std::operator<<(poVar6," <= ");
        pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
        poVar6 = std::operator<<(poVar6,pcVar11);
        goto LAB_001b5a7a;
      }
      if (dVar2 < *pdVar5) {
        poVar6 = std::operator<<(p_output,"   -Inf <= ");
LAB_001b5b5a:
        pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
        poVar6 = std::operator<<(poVar6,pcVar11);
        pcVar11 = " <= ";
        goto LAB_001b5a68;
      }
      poVar6 = std::operator<<(p_output,"  ");
      pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
      poVar6 = std::operator<<(poVar6,pcVar11);
      std::operator<<(poVar6," free\n");
    }
    else {
      poVar6 = std::operator<<(p_output,"  ");
      pcVar11 = getColName<double>(this,iVar9,p_cnames,(char *)&svec);
      poVar6 = std::operator<<(poVar6,pcVar11);
      pcVar11 = " = ";
LAB_001b5a68:
      std::operator<<(poVar6,pcVar11);
      poVar6 = std::ostream::_M_insert<double>(dVar2);
LAB_001b5a7a:
      std::operator<<(poVar6,'\n');
    }
LAB_001b5a85:
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeLPF(
   std::ostream&  p_output,          ///< output stream
   const NameSet* p_rnames,          ///< row names
   const NameSet* p_cnames,          ///< column names
   const DIdxSet* p_intvars,         ///< integer variables
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{
   SPxOut::setScientific(p_output, 16);

   LPFwriteObjective(*this, p_output, p_cnames, writeZeroObjective);
   LPFwriteRows(*this, p_output, p_rnames, p_cnames);
   LPFwriteBounds(*this, p_output, p_cnames);
   LPFwriteGenerals(*this, p_output, p_cnames, p_intvars);

   p_output << "End" << std::endl;
}